

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

ly_set * lyd_find_instance(lyd_node *data,lys_node *schema)

{
  lyd_node **pplVar1;
  lys_module *node;
  lyd_node *plVar2;
  ly_set *set;
  long lVar3;
  ly_set *set_00;
  LY_ERR *pLVar4;
  lyd_node *node_00;
  uint uVar5;
  lys_module **pplVar6;
  uint uVar7;
  ulong uVar8;
  ly_set *local_38;
  
  if ((schema == (lys_node *)0x0 || data == (lyd_node *)0x0) ||
     ((schema->nodetype & 0xc1bd) == LYS_UNKNOWN)) {
    pLVar4 = ly_errno_location();
    *pLVar4 = LY_EINVAL;
    return (ly_set *)0x0;
  }
  local_38 = ly_set_new();
  set = ly_set_new();
  if (set != (ly_set *)0x0 && local_38 != (ly_set *)0x0) {
    do {
      pplVar1 = &data->parent;
      plVar2 = data;
      data = *pplVar1;
    } while (*pplVar1 != (lyd_node *)0x0);
    do {
      node_00 = plVar2;
      plVar2 = node_00->prev;
    } while (node_00->prev->next != (lyd_node *)0x0);
    for (; schema != (lys_node *)0x0; schema = *(lys_node **)(schema->padding + lVar3 + -0x1c)) {
      lVar3 = 0x58;
      if ((schema->nodetype != LYS_AUGMENT) &&
         (lVar3 = 0x40, (schema->nodetype & 0x81bd) != LYS_UNKNOWN)) {
        ly_set_add(set,schema,1);
      }
    }
    if (set->number == 0) goto LAB_0015ce8f;
    for (; node_00 != (lyd_node *)0x0; node_00 = node_00->next) {
      if (node_00->schema == (set->set).s[set->number - 1]) {
        ly_set_add(local_38,node_00,1);
      }
    }
    uVar7 = set->number;
    while( true ) {
      if ((uVar7 - 1 == 0) || (uVar5 = local_38->number, uVar5 == 0)) {
        ly_set_free(set);
        return local_38;
      }
      set_00 = ly_set_new();
      if (set_00 == (ly_set *)0x0) break;
      for (uVar8 = 0; uVar8 < uVar5; uVar8 = uVar8 + 1) {
        pplVar6 = &(local_38->set).s[uVar8]->module;
        while (node = *pplVar6, node != (lys_module *)0x0) {
          if (node->ctx == (ly_ctx *)(set->set).s[uVar7 - 2]) {
            ly_set_add(set_00,node,1);
          }
          pplVar6 = (lys_module **)&node->dsc;
        }
        uVar5 = local_38->number;
      }
      ly_set_free(local_38);
      uVar7 = uVar7 - 1;
      local_38 = set_00;
    }
  }
  pLVar4 = ly_errno_location();
  *pLVar4 = LY_EMEM;
  ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_find_instance");
LAB_0015ce8f:
  ly_set_free(local_38);
  ly_set_free(set);
  return (ly_set *)0x0;
}

Assistant:

ly_set *
lyd_find_instance(const struct lyd_node *data, const struct lys_node *schema)
{
    struct ly_set *ret, *ret_aux, *spath;
    const struct lys_node *siter;
    struct lyd_node *iter;
    unsigned int i, j;

    if (!data || !schema ||
            !(schema->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_ACTION))) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    ret = ly_set_new();
    spath = ly_set_new();
    if (!ret || !spath) {
        LOGMEM;
        goto error;
    }

    /* find data root */
    while (data->parent) {
        /* vertical move (up) */
        data = data->parent;
    }
    while (data->prev->next) {
        /* horizontal move (left) */
        data = data->prev;
    }

    /* build schema path */
    for (siter = schema; siter; ) {
        if (siter->nodetype == LYS_AUGMENT) {
            siter = ((struct lys_node_augment *)siter)->target;
            continue;
        } else if (siter->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_RPC)) {
            /* standard data node */
            ly_set_add(spath, (void*)siter, LY_SET_OPT_USEASLIST);

        } /* else skip the rest node types */
        siter = siter->parent;
    }
    if (!spath->number) {
        /* no valid path */
        goto error;
    }

    /* start searching */
    LY_TREE_FOR((struct lyd_node *)data, iter) {
        if (iter->schema == spath->set.s[spath->number - 1]) {
            ly_set_add(ret, iter, LY_SET_OPT_USEASLIST);
        }
    }
    for (i = spath->number - 1; i; i--) {
        if (!ret->number) {
            /* nothing found */
            break;
        }

        ret_aux = ly_set_new();
        if (!ret_aux) {
            LOGMEM;
            goto error;
        }
        for (j = 0; j < ret->number; j++) {
            LY_TREE_FOR(ret->set.d[j]->child, iter) {
                if (iter->schema == spath->set.s[i - 1]) {
                    ly_set_add(ret_aux, iter, LY_SET_OPT_USEASLIST);
                }
            }
        }
        ly_set_free(ret);
        ret = ret_aux;
    }

    ly_set_free(spath);
    return ret;

error:
    ly_set_free(ret);
    ly_set_free(spath);

    return NULL;
}